

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

reference __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>_>_>
::iterator::operator*(iterator *this)

{
  ctrl_t *ctrl;
  GenerationType generation;
  GenerationType *generation_ptr;
  reference ppVar1;
  iterator *this_local;
  
  ctrl = this->ctrl_;
  generation = HashSetIteratorGenerationInfoDisabled::generation
                         ((HashSetIteratorGenerationInfoDisabled *)this);
  generation_ptr =
       HashSetIteratorGenerationInfoDisabled::generation_ptr
                 ((HashSetIteratorGenerationInfoDisabled *)this);
  AssertIsFull(ctrl,generation,generation_ptr,"operator*()");
  ppVar1 = unchecked_deref(this);
  return ppVar1;
}

Assistant:

reference operator*() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator*()");
      return unchecked_deref();
    }